

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendCommand
          (CommonCore *this,string_view target,string_view commandStr,string_view source,
          HelicsSequencingModes mode)

{
  action_t startingAction;
  bool bVar1;
  FederateState *pFVar2;
  atomic<helics::GlobalBrokerId> *paVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view str;
  string_view commandStr_local;
  ActionMessage local_100;
  string local_48 [32];
  
  commandStr_local._M_str = commandStr._M_str;
  commandStr_local._M_len = commandStr._M_len;
  __y._M_str = "flush";
  __y._M_len = 5;
  bVar1 = std::operator==(commandStr,__y);
  if (bVar1) {
    (*(this->super_Core)._vptr_Core[0x5e])
              (local_48,this,target._M_len,target._M_str,0xc,"global_flush",1);
    std::__cxx11::string::~string(local_48);
    return;
  }
  startingAction = cmd_send_command;
  if (mode == HELICS_SEQUENCING_MODE_ORDERED) {
    startingAction = cmd_send_command_ordered;
  }
  ActionMessage::ActionMessage(&local_100,startingAction);
  local_100.dest_id.gid = 0;
  SmallBuffer::operator=
            (&local_100.payload,
             (basic_string_view<char,_std::char_traits<char>_> *)&commandStr_local);
  ActionMessage::setString(&local_100,0,target);
  if (source._M_len == 0) {
    str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    str._M_len = (this->super_BrokerBase).identifier._M_string_length;
    ActionMessage::setString(&local_100,1,str);
    paVar3 = &(this->super_BrokerBase).global_id;
  }
  else {
    ActionMessage::setString(&local_100,1,source);
    pFVar2 = getFederate(this,source);
    if (pFVar2 == (FederateState *)0x0) goto LAB_0029dab8;
    paVar3 = (atomic<helics::GlobalBrokerId> *)&pFVar2->global_id;
  }
  local_100.source_id.gid = (((atomic<helics::GlobalFederateId> *)paVar3)->_M_i).gid;
LAB_0029dab8:
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_100);
  ActionMessage::~ActionMessage(&local_100);
  return;
}

Assistant:

void CommonCore::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             std::string_view source,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED ?
                             CMD_SEND_COMMAND_ORDERED :
                             CMD_SEND_COMMAND);
    cmdcmd.dest_id = parent_broker_id;
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    if (!source.empty()) {
        cmdcmd.setString(sourceStringLoc, source);
        const auto* fed = getFederate(source);
        if (fed != nullptr) {
            cmdcmd.source_id = fed->global_id;
        }
    } else {
        cmdcmd.setString(sourceStringLoc, getIdentifier());
        cmdcmd.source_id = getGlobalId();
    }
    addActionMessage(std::move(cmdcmd));
}